

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::clear
          (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  CLI::std::lock_guard<std::mutex>::lock_guard
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  CLI::std::lock_guard<std::mutex>::lock_guard
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x5a0e00);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x5a0e0e);
  CLI::std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffcf);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5a0e2e);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5a0e38);
  return;
}

Assistant:

void clear()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pullElements.clear();
            pushElements.clear();
            queueEmptyFlag = true;
        }